

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O3

void __thiscall
spdlog::details::level_formatter::format
          (level_formatter *this,log_msg *msg,tm *param_2,memory_buffer *dest)

{
  void *pvVar1;
  size_t wrapped_size;
  size_t __n;
  long lVar2;
  ptrdiff_t _Num_1;
  ulong uVar3;
  ptrdiff_t _Num;
  char *buf_ptr;
  scoped_pad p;
  scoped_pad sStack_48;
  
  lVar2 = (ulong)msg->level * 0x10;
  if ((this->super_flag_formatter).padinfo_.width_ == 0) {
    pvVar1 = *(void **)(level::level_string_views + lVar2);
    if (pvVar1 != (void *)0x0) {
      __n = *(size_t *)(level::level_string_views + lVar2 + 8);
      uVar3 = (dest->super_basic_buffer<char>).size_ + __n;
      if ((dest->super_basic_buffer<char>).capacity_ < uVar3) {
        (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest,uVar3);
      }
      if (__n != 0) {
        memmove((dest->super_basic_buffer<char>).ptr_ + (dest->super_basic_buffer<char>).size_,
                pvVar1,__n);
      }
      (dest->super_basic_buffer<char>).size_ = uVar3;
    }
  }
  else {
    pvVar1 = *(void **)(level::level_string_views + lVar2);
    wrapped_size = *(size_t *)(level::level_string_views + lVar2 + 8);
    scoped_pad::scoped_pad(&sStack_48,wrapped_size,&(this->super_flag_formatter).padinfo_,dest);
    if (pvVar1 != (void *)0x0) {
      uVar3 = (dest->super_basic_buffer<char>).size_ + wrapped_size;
      if ((dest->super_basic_buffer<char>).capacity_ < uVar3) {
        (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest,uVar3);
      }
      if (wrapped_size != 0) {
        memmove((dest->super_basic_buffer<char>).ptr_ + (dest->super_basic_buffer<char>).size_,
                pvVar1,wrapped_size);
      }
      (dest->super_basic_buffer<char>).size_ = uVar3;
    }
    scoped_pad::~scoped_pad(&sStack_48);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, fmt::memory_buffer &dest) override
    {
        string_view_t &level_name = level::to_string_view(msg.level);
        if (padinfo_.enabled())
        {
            scoped_pad p(level_name, padinfo_, dest);
            fmt_helper::append_string_view(level_name, dest);
        }
        else
        {
            fmt_helper::append_string_view(level_name, dest);
        }
    }